

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_global_variables(Impl *this)

{
  GlobalVariable *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  LinkageTypes LVar4;
  TypeID TVar5;
  Id IVar6;
  Id IVar7;
  ValueKind VVar8;
  StorageClass storage;
  Module *this_01;
  __normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
  _Var9;
  __normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
  _Var10;
  Type *pTVar11;
  Type *pTVar12;
  Builder *pBVar13;
  Builder *pBVar14;
  uint64_t uVar15;
  Constant *value;
  Value *this_02;
  LoggingCallback p_Var16;
  void *pvVar17;
  IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
  IVar18;
  Constant *constant;
  char cVar19;
  char buffer [4096];
  char local_1038 [4104];
  
  this_01 = LLVMBCParser::get_module(this->bitcode_parser);
  if (((this->execution_model - ExecutionModelIntersectionKHR < 5) &&
      (bVar1 = emit_incoming_payload(this), !bVar1)) ||
     ((this->execution_model - ExecutionModelIntersectionKHR < 3 &&
      (bVar1 = emit_hit_attribute(this), !bVar1)))) {
    bVar1 = false;
  }
  else {
    _Var9._M_current = (GlobalVariable **)LLVMBC::Module::global_begin(this_01);
    _Var10._M_current = (GlobalVariable **)LLVMBC::Module::global_end(this_01);
    bVar1 = true;
    if (_Var9._M_current != _Var10._M_current) {
      do {
        this_00 = *_Var9._M_current;
        pTVar11 = LLVMBC::Value::getType((Value *)this_00);
        uVar3 = LLVMBC::Type::getAddressSpace(pTVar11);
        LVar4 = LLVMBC::GlobalVariable::getLinkage(this_00);
        cVar19 = (char)uVar3;
        if ((LVar4 != ExternalLinkage || cVar19 == '\x03') &&
           (LVar4 = LLVMBC::GlobalVariable::getLinkage(this_00), LVar4 != AppendingLinkage)) {
          if (cVar19 == '\x03') {
LAB_0011eaf2:
            bVar1 = false;
            IVar6 = 0;
            if ((this->shader_analysis).require_wmma == true) {
              pTVar11 = LLVMBC::Value::getType((Value *)this_00);
              pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
              if (pTVar11 == (Type *)0x0) {
                pTVar11 = (Type *)0x0;
              }
              else {
                TVar5 = LLVMBC::Type::getTypeID(pTVar11);
                if (TVar5 != ArrayTyID) {
                  pTVar11 = (Type *)0x0;
                }
              }
              if (pTVar11 == (Type *)0x0) {
                bVar1 = false;
                IVar6 = 0;
              }
              else {
                pTVar12 = LLVMBC::Type::getArrayElementType(pTVar11);
                bVar1 = false;
                IVar6 = get_type_id(this,pTVar12,0);
                uVar15 = LLVMBC::Type::getArrayNumElements(pTVar11);
                pTVar11 = LLVMBC::Type::getArrayElementType(pTVar11);
                uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar11);
                pBVar13 = SPIRVModule::get_builder(this->spirv_module);
                pBVar14 = SPIRVModule::get_builder(this->spirv_module);
                IVar7 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
                IVar7 = spv::Builder::makeIntConstant
                                  (pBVar14,IVar7,
                                   ((int)uVar15 + 0x1000 / uVar3) - 1 & -(0x1000 / uVar3),false);
                IVar6 = spv::Builder::makeArrayType(pBVar13,IVar6,IVar7,0);
              }
            }
          }
          else {
            IVar6 = 0;
            if ((uVar3 & 0xff) == 0) {
              if ((((this->options).extended_robustness.constant_lut == true) &&
                  (bVar1 = LLVMBC::GlobalVariable::hasInitializer(this_00), bVar1)) &&
                 (bVar1 = LLVMBC::GlobalVariable::isConstant(this_00), bVar1)) {
                pTVar11 = LLVMBC::Value::getType((Value *)this_00);
                pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
                if (pTVar11 == (Type *)0x0) {
                  pTVar11 = (Type *)0x0;
                }
                else {
                  TVar5 = LLVMBC::Type::getTypeID(pTVar11);
                  if (TVar5 != ArrayTyID) {
                    pTVar11 = (Type *)0x0;
                  }
                }
                bVar1 = pTVar11 != (Type *)0x0;
                IVar6 = 0;
                if (bVar1) {
                  pTVar12 = LLVMBC::Type::getArrayElementType(pTVar11);
                  IVar6 = get_type_id(this,pTVar12,0);
                  pBVar13 = SPIRVModule::get_builder(this->spirv_module);
                  pBVar14 = SPIRVModule::get_builder(this->spirv_module);
                  uVar15 = LLVMBC::Type::getArrayNumElements(pTVar11);
                  IVar7 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
                  IVar7 = spv::Builder::makeIntConstant(pBVar14,IVar7,(int)uVar15 + 1,false);
                  IVar6 = spv::Builder::makeArrayType(pBVar13,IVar6,IVar7,0);
                  bVar1 = true;
                }
              }
              else {
                bVar1 = false;
                IVar6 = 0;
                if (cVar19 == '\x03') goto LAB_0011eaf2;
              }
            }
            else {
              bVar1 = false;
            }
          }
          if (IVar6 == 0) {
            pTVar11 = LLVMBC::Value::getType((Value *)this_00);
            pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
            IVar6 = get_type_id(this,pTVar11,0);
          }
          if (IVar6 != 0) {
            bVar2 = LLVMBC::GlobalVariable::hasInitializer(this_00);
            if (bVar2) {
              value = LLVMBC::GlobalVariable::getInitializer(this_00);
            }
            else {
              value = (Constant *)0x0;
            }
            if (value == (Constant *)0x0) {
              constant = (Constant *)0x0;
            }
            else {
              this_02 = LLVMBC::Internal::resolve_proxy(&value->super_Value);
              VVar8 = LLVMBC::Value::get_value_kind(this_02);
              constant = (Constant *)0x0;
              if (VVar8 != Undef) {
                constant = value;
              }
            }
            if ((cVar19 == '\x03') && (constant != (Constant *)0x0)) {
              p_Var16 = get_thread_log_callback();
              if (p_Var16 == (LoggingCallback)0x0) {
                emit_global_variables();
              }
              else {
                memcpy(local_1038,
                       "Global variable address space cannot have initializer! Ignoring ...\n",0x45)
                ;
                pvVar17 = get_thread_log_callback_userdata();
                (*p_Var16)(pvVar17,Warn,local_1038);
              }
              constant = (Constant *)0x0;
            }
            if (constant == (Constant *)0x0) {
              IVar7 = 0;
            }
            else if (bVar1) {
              IVar7 = get_padded_constant_array(this,IVar6,constant);
            }
            else {
              IVar7 = get_id_for_constant(this,constant,0);
            }
            storage = get_effective_storage_class
                                (this,(Value *)this_00,
                                 (uint)(cVar19 != '\x03') * 2 + StorageClassWorkgroup);
            IVar6 = SPIRVModule::create_variable_with_initializer
                              (this->spirv_module,storage,IVar6,IVar7,(char *)0x0);
            pTVar11 = LLVMBC::Value::getType((Value *)this_00);
            pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
            decorate_relaxed_precision(this,pTVar11,IVar6,false);
            rewrite_value(this,(Value *)this_00,IVar6);
          }
        }
        _Var9._M_current = _Var9._M_current + 1;
        IVar18 = LLVMBC::Module::global_end(this_01);
      } while ((__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
                )_Var9._M_current != IVar18.iter._M_current);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool Converter::Impl::emit_global_variables()
{
	auto &module = bitcode_parser.get_module();

	if (execution_model_has_incoming_payload(execution_model))
		if (!emit_incoming_payload())
			return false;

	if (execution_model_has_hit_attribute(execution_model))
		if (!emit_hit_attribute())
			return false;

	for (auto itr = module.global_begin(); itr != module.global_end(); ++itr)
	{
		llvm::GlobalVariable &global = *itr;

		auto address_space = static_cast<DXIL::AddressSpace>(global.getType()->getAddressSpace());

		// Workarounds for DXR. RT resources tend to be declared with external linkage + structs.
		// Groupshared is also declared with external linkage, even if that is bogus.
		// Make sure we declare global internal struct LUTs at the very least ...
		if (global.getLinkage() == llvm::GlobalVariable::ExternalLinkage &&
		    address_space != DXIL::AddressSpace::GroupShared)
		{
			continue;
		}

		// Ignore @llvm.global_ctors(). Only observed once with dummy ctor.
		// It probably is not intended to work.
		if (global.getLinkage() == llvm::GlobalVariable::AppendingLinkage)
			continue;

		spv::Id pointee_type_id = 0;
		spv::Id scalar_type_id = 0;
		bool padded_composite = false;

		if (address_space == DXIL::AddressSpace::Thread &&
		    options.extended_robustness.constant_lut &&
		    global.hasInitializer() &&
		    global.isConstant())
		{
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(array_type->getArrayNumElements() + 1), false);
				padded_composite = true;
			}
		}
		else if (address_space == DXIL::AddressSpace::GroupShared &&
		         shader_analysis.require_wmma)
		{
			// Workaround for bugged WMMA shaders.
			// The shaders rely on AMD aligning LDS size to 512 bytes.
			// This avoids overflow spilling into LDSTranspose area by mistake, which breaks some shaders.
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				uint32_t elem_count = array_type->getArrayNumElements();
				uint32_t alignment = (512 * 8) / array_type->getArrayElementType()->getIntegerBitWidth();
				elem_count = (elem_count + alignment - 1) & ~(alignment - 1);
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(elem_count), false);
			}
		}

		if (!pointee_type_id)
			pointee_type_id = get_type_id(global.getType()->getPointerElementType());

		// Happens for some global variables in DXR for some reason, benign.
		if (pointee_type_id == 0)
			continue;

		spv::Id initializer_id = 0;

		llvm::Constant *initializer = nullptr;
		if (global.hasInitializer())
			initializer = global.getInitializer();
		if (initializer && llvm::isa<llvm::UndefValue>(initializer))
			initializer = nullptr;

		if (address_space == DXIL::AddressSpace::GroupShared)
		{
			if (initializer)
			{
				// FIXME: Is this even legal DXIL?
				LOGW("Global variable address space cannot have initializer! Ignoring ...\n");
				initializer = nullptr;
			}
		}

		if (initializer)
		{
			if (padded_composite)
				initializer_id = get_padded_constant_array(pointee_type_id, initializer);
			else
				initializer_id = get_id_for_constant(initializer, 0);
		}

		spv::StorageClass storage_class = address_space == DXIL::AddressSpace::GroupShared
		                                  ? spv::StorageClassWorkgroup : spv::StorageClassPrivate;
		spv::Id var_id = create_variable_with_initializer(
			get_effective_storage_class(&global, storage_class),
			pointee_type_id, initializer_id);

		decorate_relaxed_precision(global.getType()->getPointerElementType(), var_id, false);
		rewrite_value(&global, var_id);
	}

	return true;
}